

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O3

void thread_rwlock_trylock_peer(void *unused)

{
  int iVar1;
  
  uv_mutex_lock(&mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161cd4;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_00161cd9;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_00161cde;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_wrunlock(&rwlock);
      iVar1 = uv_rwlock_tryrdlock(&rwlock);
      if (iVar1 == 0) {
        synchronize();
        uv_rwlock_rdunlock(&rwlock);
        step = step + 1;
        uv_cond_signal(&condvar);
        uv_mutex_unlock(&mutex);
        return;
      }
      goto LAB_00161ce8;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_00161cd4:
    thread_rwlock_trylock_peer_cold_2();
LAB_00161cd9:
    thread_rwlock_trylock_peer_cold_3();
LAB_00161cde:
    thread_rwlock_trylock_peer_cold_4();
  }
  thread_rwlock_trylock_peer_cold_5();
LAB_00161ce8:
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  uv_cond_signal(&condvar);
  iVar1 = step;
  do {
    uv_cond_wait(&condvar,&mutex);
  } while (iVar1 == step);
  if (step == iVar1 + 1) {
    return;
  }
  synchronize_cold_1();
  return;
}

Assistant:

static void thread_rwlock_trylock_peer(void* unused) {
  (void) &unused;

  uv_mutex_lock(&mutex);

  /* Write lock held by other thread. */
  ASSERT(UV_EBUSY == uv_rwlock_tryrdlock(&rwlock));
  ASSERT(UV_EBUSY == uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT(0 == uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT(UV_EBUSY == uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Acquire write lock. */
  ASSERT(0 == uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Release write lock and acquire read lock. */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT(0 == uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  uv_rwlock_rdunlock(&rwlock);
  synchronize_nowait();  /* Signal main thread we're going away. */
  uv_mutex_unlock(&mutex);
}